

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O0

bool ViewHdd(string *path,Range range)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  exception *this;
  element_type *peVar5;
  uint8_t *pv;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  uint *puVar9;
  uint local_19c;
  long local_128;
  int local_108;
  int show_end;
  undefined1 local_100 [4];
  int show_begin;
  string local_e0;
  string local_c0;
  undefined4 local_9c;
  string local_98;
  long local_78;
  long lba_sector;
  long sector;
  int head;
  int cyl;
  MEMORY mem;
  undefined1 local_38 [8];
  shared_ptr<HDD> hdd;
  string *path_local;
  Range range_local;
  
  range_local._0_8_ = range._8_8_;
  register0x00000030 = range._0_8_;
  hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path;
  HDD::OpenDisk((HDD *)local_38,path);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (!bVar3) {
    Error("open");
  }
  bVar3 = Range::empty((Range *)((long)&path_local + 4));
  if ((!bVar3) &&
     ((iVar4 = Range::cyls((Range *)((long)&path_local + 4)), iVar4 != 1 ||
      (iVar4 = Range::heads((Range *)((long)&path_local + 4)), iVar4 != 1)))) {
    this = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[34]>
              (this,(char (*) [34])"HDD view ranges are not supported");
    __cxa_throw(this,&util::exception::typeinfo,util::exception::~exception);
  }
  peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_38
                     );
  MEMORY::MEMORY((MEMORY *)&head,peVar5->sector_size);
  sector._4_4_ = path_local._4_4_;
  sector._0_4_ = range_local.cyl_begin;
  if (opt.sectors < 0) {
    local_128 = 0;
  }
  else {
    local_128 = opt.sectors;
  }
  lba_sector = local_128;
  local_78 = local_128;
  bVar3 = Range::empty((Range *)((long)&path_local + 4));
  iVar4 = sector._4_4_;
  if (!bVar3) {
    peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    iVar1 = (int)sector;
    if ((((peVar5->cyls <= iVar4) ||
         (peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              local_38), lVar2 = lba_sector, peVar5->heads <= iVar1)) ||
        (peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             local_38), iVar4 = sector._4_4_, peVar5->sectors < lVar2)) ||
       (lba_sector == 0)) {
      peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_38);
      iVar4 = peVar5->cyls;
      peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_38);
      iVar1 = peVar5->heads;
      peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_38);
      util::fmt_abi_cxx11_
                (&local_98,"Invalid CHS address for drive (Cyl 0-%d, Head 0-%u, Sector 1-%u)\n",
                 (ulong)(iVar4 - 1),(ulong)(iVar1 - 1),(ulong)(uint)peVar5->sectors);
      util::operator<<((LogHelper *)&util::cout,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      range_local.head_begin._3_1_ = 0;
      goto LAB_001eee7a;
    }
    peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    iVar4 = iVar4 * peVar5->heads + (int)sector;
    peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    local_78 = (long)(iVar4 * peVar5->sectors) + lba_sector + -1;
  }
  lVar2 = local_78;
  peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_38
                     );
  if (lVar2 < peVar5->total_sectors) {
    peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    bVar3 = HDD::Seek(peVar5,local_78);
    if (bVar3) {
      peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_38);
      pv = MEMORY::operator_cast_to_unsigned_char_((MEMORY *)&head);
      iVar4 = HDD::Read(peVar5,pv,1,false);
      if (iVar4 != 0) {
        bVar3 = Range::empty((Range *)((long)&path_local + 4));
        if (bVar3) {
          util::fmt_abi_cxx11_
                    ((string *)local_100,"LBA Sector %u (%u bytes):\n\n",local_78,
                     (ulong)(uint)mem._vptr_MEMORY);
          util::operator<<((LogHelper *)&util::cout,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100);
          std::__cxx11::string::~string((string *)local_100);
        }
        else {
          pcVar6 = CylStr(sector._4_4_);
          pcVar7 = HeadStr((int)sector);
          util::fmt_abi_cxx11_
                    (&local_e0,"Cyl %s Head %s Sector %u (LBA %s):\n",pcVar6,pcVar7,lba_sector,
                     local_78);
          util::operator<<((LogHelper *)&util::cout,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        local_108 = 0;
        piVar8 = std::max<int>(&opt.bytes_begin,&local_108);
        show_end = *piVar8;
        if (opt.bytes_end < 0) {
          local_19c = (uint)mem._vptr_MEMORY;
        }
        else {
          puVar9 = (uint *)std::min<int>(&opt.bytes_end,(int *)&mem);
          local_19c = *puVar9;
        }
        util::hex_dump<unsigned_char*>
                  ((uchar *)mem._8_8_,(uchar *)(mem._8_8_ + (long)(int)local_19c),show_end,
                   (colour *)0x0,0x10);
        range_local.head_begin._3_1_ = 1;
        goto LAB_001eee7a;
      }
    }
    Error("read");
  }
  else {
    peVar5 = std::__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<HDD,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    util::fmt_abi_cxx11_
              (&local_c0,"LBA value out of drive range (%u sectors).\n",peVar5->total_sectors);
    util::operator<<((LogHelper *)&util::cout,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  range_local.head_begin._3_1_ = 0;
LAB_001eee7a:
  local_9c = 1;
  MEMORY::~MEMORY((MEMORY *)&head);
  std::shared_ptr<HDD>::~shared_ptr((shared_ptr<HDD> *)local_38);
  return (bool)(range_local.head_begin._3_1_ & 1);
}

Assistant:

bool ViewHdd(const std::string& path, Range range)
{
    auto hdd = HDD::OpenDisk(path);
    if (!hdd)
        Error("open");

    if (!range.empty() && (range.cyls() != 1 || range.heads() != 1))
        throw util::exception("HDD view ranges are not supported");

    MEMORY mem(hdd->sector_size);

    auto cyl = range.cyl_begin;
    auto head = range.head_begin;
    auto sector = (opt.sectors < 0) ? 0 : opt.sectors;
    auto lba_sector = sector;

    if (!range.empty())
    {
        if (cyl >= hdd->cyls || head >= hdd->heads || sector > hdd->sectors || !sector)
        {
            util::cout << util::fmt("Invalid CHS address for drive (Cyl 0-%d, Head 0-%u, Sector 1-%u)\n",
                hdd->cyls - 1, hdd->heads - 1, hdd->sectors);
            return false;
        }

        // Convert CHS address to LBA
        lba_sector = (cyl * hdd->heads + head) * hdd->sectors + (sector - 1);
    }

    if (lba_sector >= hdd->total_sectors)
        util::cout << util::fmt("LBA value out of drive range (%u sectors).\n", hdd->total_sectors);
    else if (!hdd->Seek(lba_sector) || !hdd->Read(mem, 1))
        Error("read");
    else
    {
        if (!range.empty())
            util::cout << util::fmt("Cyl %s Head %s Sector %u (LBA %s):\n", CylStr(cyl), HeadStr(head), sector, lba_sector);
        else
            util::cout << util::fmt("LBA Sector %u (%u bytes):\n\n", lba_sector, mem.size);

        auto show_begin = std::max(opt.bytes_begin, 0);
        auto show_end = (opt.bytes_end < 0) ? mem.size :
            std::min(opt.bytes_end, mem.size);
        util::hex_dump(mem.pb, mem.pb + show_end, show_begin);
        return true;
    }

    return false;
}